

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponseCode.h
# Opt level: O3

Value io::aeron::archive::codecs::ControlResponseCode::get(int32_t value)

{
  runtime_error *this;
  
  if ((uint)value < 3) {
    return value;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"unknown value for enum ControlResponseCode [E103]");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ControlResponseCode::Value get(const std::int32_t value)
    {
        switch (value)
        {
            case 0: return OK;
            case 1: return ERROR;
            case 2: return RECORDING_UNKNOWN;
            case -2147483648: return NULL_VALUE;
        }

        throw std::runtime_error("unknown value for enum ControlResponseCode [E103]");
    }